

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O0

void __thiscall
Base64Test_EncodeBlock_Test::~Base64Test_EncodeBlock_Test(Base64Test_EncodeBlock_Test *this)

{
  ~Base64Test_EncodeBlock_Test
            ((Base64Test_EncodeBlock_Test *)
             &this[-1].super_Base64Test.super_TestWithParam<Base64TestVector>.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(Base64Test, EncodeBlock) {
  const Base64TestVector &t = GetParam();
  if (t.relation != canonical) {
    return;
  }

  const size_t decoded_len = strlen(t.decoded);
  size_t max_encoded_len;
  ASSERT_TRUE(EVP_EncodedLength(&max_encoded_len, decoded_len));

  std::vector<uint8_t> out_vec(max_encoded_len);
  uint8_t *out = out_vec.data();
  size_t len = EVP_EncodeBlock(out, (const uint8_t *)t.decoded, decoded_len);

  std::string encoded(RemoveNewlines(t.encoded));
  EXPECT_EQ(Bytes(encoded), Bytes(out, len));
}